

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool cmsys::SystemTools::GetPermissions(char *file,mode_t *mode)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  stat st;
  long *local_d8 [2];
  long local_c8 [2];
  stat64 local_b8;
  
  if (file == (char *)0x0) {
    bVar3 = false;
  }
  else {
    local_d8[0] = local_c8;
    sVar2 = strlen(file);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,file,file + sVar2);
    iVar1 = stat64((char *)local_d8[0],&local_b8);
    bVar3 = -1 < iVar1;
    if (bVar3) {
      *mode = local_b8.st_mode;
    }
    if (local_d8[0] != local_c8) {
      operator_delete(local_d8[0],local_c8[0] + 1);
    }
  }
  return bVar3;
}

Assistant:

bool SystemTools::GetPermissions(const char* file, mode_t& mode)
{
  if ( !file )
    {
    return false;
    }
  return SystemTools::GetPermissions(std::string(file), mode);
}